

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

void failure_finish(void *extra)

{
  int iVar1;
  undefined8 extraout_RAX;
  char *__path;
  wchar_t in_ESI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  
  if (dump_on_failure == '\x01') {
    failure_finish_cold_1();
    assertions = assertions + L'\x01';
    msg = nextmsg;
    nextmsg = (char *)0x0;
    uVar2 = extraout_RAX;
    iVar1 = chdir(__path);
    if (iVar1 != 0) {
      failure_start((char *)extra,in_ESI,"chdir(\"%s\")",__path,in_R8,in_R9,uVar2);
      failure_finish(extra);
    }
    return;
  }
  return;
}

Assistant:

static void
failure_finish(void *extra)
{
	(void)extra; /* UNUSED (maybe) */
#ifdef EXTRA_DUMP
	if (extra != NULL) {
		logprintf("    errno: %d\n", EXTRA_ERRNO(extra));
		logprintf("   detail: %s\n", EXTRA_DUMP(extra));
	}
#endif

	if (dump_on_failure) {
		fprintf(stderr,
		    " *** forcing core dump so failure can be debugged ***\n");
		abort();
	}
}